

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  ImVec2 pos;
  ImVec2 pos_00;
  ImVec2 size;
  ImVec2 size_00;
  bool bVar1;
  int iVar2;
  float *in_RCX;
  uint in_EDX;
  float *in_RSI;
  char *in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float bar1_line_y;
  ImRect bar1_bb;
  float alpha;
  float sv_cursor_rad;
  float bar0_line_y;
  int i;
  ImVec2 uv_white;
  ImVec2 trc;
  ImVec2 trb;
  ImVec2 tra;
  int hue_cursor_segments;
  float hue_cursor_rad;
  ImVec2 hue_cursor_pos;
  float sin_hue_angle_1;
  float cos_hue_angle_1;
  ImVec2 gradient_p1;
  ImVec2 gradient_p0;
  int vert_end_idx;
  int vert_start_idx;
  float a1;
  float a0;
  int n;
  int segment_per_arc;
  float aeps;
  ImVec2 sv_cursor_pos;
  ImU32 hue_colors [7];
  ImU32 col32_no_alpha;
  ImU32 hue_color32;
  ImVec4 hue_color_f;
  float new_V;
  float new_S;
  float new_H;
  ImGuiColorEditFlags sub_flags;
  ImGuiColorEditFlags sub_flags_to_forward;
  bool value_changed_fix_hue_wrap;
  ImVec4 ref_col_v4;
  ImVec4 col_v4;
  char *label_display_end;
  float ww;
  float vv;
  float uu;
  ImVec2 current_off_unrotated;
  float sin_hue_angle;
  float cos_hue_angle;
  float initial_dist2;
  ImVec2 current_off;
  ImVec2 initial_off;
  bool value_changed_sv;
  bool value_changed_h;
  bool value_changed;
  float V;
  float S;
  float H;
  ImVec2 triangle_pc;
  ImVec2 triangle_pb;
  ImVec2 triangle_pa;
  float triangle_r;
  ImVec2 wheel_center;
  float wheel_r_inner;
  float wheel_r_outer;
  float wheel_thickness;
  float backup_initial_col [4];
  float bars_triangles_half_sz;
  float bar1_pos_x;
  float bar0_pos_x;
  float sv_picker_size;
  float bars_width;
  float square_sz;
  ImVec2 picker_pos;
  bool alpha_bar;
  int components;
  ImGuiIO *io;
  ImGuiStyle *style;
  ImDrawList *draw_list;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_fffffffffffffb38;
  ImVec2 *lhs;
  uint uVar7;
  float in_stack_fffffffffffffb40;
  float in_stack_fffffffffffffb44;
  ImVec2 *in_stack_fffffffffffffb48;
  ImRect *this;
  ImDrawList *in_stack_fffffffffffffb50;
  ImU32 col_bot_right;
  ImU32 in_stack_fffffffffffffb58;
  float in_stack_fffffffffffffb5c;
  float in_stack_fffffffffffffb60;
  undefined4 uVar8;
  float in_stack_fffffffffffffb64;
  ImVec2 *in_stack_fffffffffffffb68;
  float in_stack_fffffffffffffb70;
  float in_stack_fffffffffffffb74;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffb78;
  float in_stack_fffffffffffffb7c;
  ImVec2 in_stack_fffffffffffffb80;
  ImVec2 *in_stack_fffffffffffffb88;
  ImDrawList *in_stack_fffffffffffffb90;
  ImVec2 in_stack_fffffffffffffb98;
  ImVec2 in_stack_fffffffffffffba0;
  ImVec2 in_stack_fffffffffffffba8;
  ImVec2 in_stack_fffffffffffffbb0;
  ImVec2 in_stack_fffffffffffffbb8;
  float in_stack_fffffffffffffbc0;
  float in_stack_fffffffffffffbc4;
  float local_3ec;
  byte local_3b9;
  undefined4 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc5c;
  undefined4 in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc64;
  float local_388;
  ImVec4 *in_stack_fffffffffffffc88;
  char *in_stack_fffffffffffffc90;
  float in_stack_fffffffffffffc9c;
  float in_stack_fffffffffffffca0;
  byte local_34d;
  uint local_34c;
  ImVec2 local_348;
  ImVec2 local_340;
  ImVec2 local_338;
  ImVec2 local_330;
  float local_324;
  ImVec2 local_320;
  ImVec2 local_318;
  ImVec2 local_310;
  ImRect local_308;
  float local_2f8;
  undefined4 local_2f4;
  ImVec2 local_2f0;
  ImVec2 local_2e8;
  ImVec2 local_2e0;
  ImVec2 local_2d8;
  float local_2d0;
  ImVec2 local_2cc;
  ImVec2 local_2c4;
  int local_2bc;
  undefined1 local_2b8 [8];
  ImVec2 local_2b0;
  ImVec2 local_2a8;
  undefined1 local_2a0 [8];
  ImVec2 local_298;
  ImVec2 local_288;
  ImVec2 local_280;
  ImVec2 local_278;
  ImVec2 local_270;
  ImVec2 local_268;
  ImVec2 local_260;
  ImVec2 local_258;
  ImVec2 local_250;
  ImVec2 local_248;
  ImVec2 local_240;
  int local_238;
  float local_234;
  ImVec2 local_230;
  float local_228;
  ImGuiColorEditFlags in_stack_fffffffffffffddc;
  float *in_stack_fffffffffffffde0;
  void **in_stack_fffffffffffffde8;
  ImVec2 local_20c;
  ImVec2 local_204;
  int local_1fc;
  int local_1f8;
  float local_1f4;
  float local_1f0;
  int local_1ec;
  int local_1e8;
  float local_1e4;
  ImVec2 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined4 local_1c0;
  ImVec4 local_1b0;
  ImU32 local_1a0;
  ImU32 local_19c;
  ImVec4 local_198;
  float local_188;
  float local_184;
  float local_180;
  uint local_17c;
  undefined4 local_178;
  byte local_171;
  ImVec2 local_170;
  ImVec4 local_168;
  ImVec2 local_158;
  ImVec4 local_150;
  char *local_140;
  ImVec2 local_138;
  ImVec2 local_130;
  ImVec2 local_128;
  ImVec2 local_120;
  ImVec2 local_118;
  ImVec2 local_110;
  float local_108;
  ImVec2 local_104;
  ImVec2 local_fc;
  ImVec2 local_f4;
  float local_ec;
  float local_e8;
  float local_e4;
  ImVec2 local_e0;
  ImVec2 local_d8;
  ImVec2 local_d0;
  byte local_c7;
  byte local_c6;
  byte local_c5;
  float local_c4;
  float local_c0;
  float local_bc;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  float local_a0;
  ImVec2 local_9c;
  float local_94;
  float local_90;
  float local_8c;
  undefined1 local_88 [24];
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  ImVec2 local_58;
  byte local_4d;
  int local_4c;
  ImGuiIO *local_48;
  ImGuiStyle *local_40;
  ImVec2 local_38;
  ImGuiWindow *local_30;
  ImGuiContext *local_28;
  float *local_20;
  uint local_14;
  float *local_10;
  char *local_8;
  
  local_28 = GImGui;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_30 = GetCurrentWindow();
  local_38 = (ImVec2)local_30->DrawList;
  local_40 = &local_28->Style;
  local_48 = &local_28->IO;
  PushID((char *)in_stack_fffffffffffffb50);
  BeginGroup();
  if ((local_14 & 0x100) == 0) {
    local_14 = local_14 | 0x10;
  }
  if ((local_14 & 8) == 0) {
    ColorPickerOptionsPopup
              ((float *)in_stack_fffffffffffffb80,(ImGuiColorEditFlags)in_stack_fffffffffffffb7c);
  }
  if ((local_14 & 0x6000000) == 0) {
    if ((local_28->ColorEditOptions & 0x6000000U) == 0) {
      local_34c = 0x2900000;
    }
    else {
      local_34c = local_28->ColorEditOptions;
    }
    local_14 = local_34c & 0x6000000 | local_14;
  }
  if ((local_14 & 8) == 0) {
    local_14 = local_28->ColorEditOptions & 0x10000U | local_14;
  }
  local_4c = 4;
  if ((local_14 & 2) != 0) {
    local_4c = 3;
  }
  local_34d = 0;
  if ((local_14 & 0x10000) != 0) {
    local_34d = (local_14 & 2) != 0 ^ 0xff;
  }
  local_4d = local_34d & 1;
  local_58 = (local_30->DC).CursorPos;
  local_60 = GetFrameHeight();
  fVar3 = local_60 * 1.0;
  local_5c = local_60;
  fVar4 = CalcItemWidth();
  iVar2 = 1;
  if ((local_4d & 1) != 0) {
    iVar2 = 2;
  }
  local_64 = ImMax<float>(fVar3,-(float)iVar2 * (local_60 + (local_40->ItemInnerSpacing).x) + fVar4)
  ;
  local_68 = local_58.x + local_64 + (local_40->ItemInnerSpacing).x;
  local_6c = local_68 + local_60 + (local_40->ItemInnerSpacing).x;
  local_70 = (float)(int)(local_60 * 0.2);
  memcpy(local_88,local_10,(long)local_4c << 2);
  local_8c = local_64 * 0.08;
  local_90 = local_64 * 0.5;
  local_94 = local_90 - local_8c;
  ImVec2::ImVec2(&local_9c,(local_64 + local_60) * 0.5 + local_58.x,local_64 * 0.5 + local_58.y);
  local_a0 = local_94 - (float)(int)(local_64 * 0.027);
  ImVec2::ImVec2(&local_a8,local_a0,0.0);
  ImVec2::ImVec2(&local_b0,local_a0 * -0.5,local_a0 * -0.866025);
  ImVec2::ImVec2(&local_b8,local_a0 * -0.5,local_a0 * 0.866025);
  ColorConvertRGBtoHSV
            (in_stack_fffffffffffffb64,in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c,
             (float *)in_stack_fffffffffffffb50,&in_stack_fffffffffffffb48->x,
             (float *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  local_c5 = 0;
  local_c6 = 0;
  local_c7 = 0;
  PushItemFlag((ImGuiItemFlags)in_stack_fffffffffffffb44,
               SUB41((uint)in_stack_fffffffffffffb40 >> 0x18,0));
  if ((local_14 & 0x4000000) == 0) {
    if ((local_14 & 0x2000000) != 0) {
      ImVec2::ImVec2(&local_118,local_64,local_64);
      InvisibleButton((char *)in_stack_fffffffffffffb88,(ImVec2 *)in_stack_fffffffffffffb80);
      bVar1 = IsItemActive();
      if (bVar1) {
        local_c0 = ImSaturate(((local_48->MousePos).x - local_58.x) / (local_64 - 1.0));
        local_c4 = ImSaturate(((local_48->MousePos).y - local_58.y) / (local_64 - 1.0));
        local_c4 = 1.0 - local_c4;
        local_c7 = 1;
        local_c5 = 1;
      }
      if ((local_14 & 8) == 0) {
        OpenPopupOnItemClick((char *)in_stack_fffffffffffffb48,(int)in_stack_fffffffffffffb44);
      }
      ImVec2::ImVec2(&local_120,local_68,local_58.y);
      SetCursorScreenPos((ImVec2 *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      ImVec2::ImVec2(&local_128,local_60,local_64);
      InvisibleButton((char *)in_stack_fffffffffffffb88,(ImVec2 *)in_stack_fffffffffffffb80);
      bVar1 = IsItemActive();
      if (bVar1) {
        local_bc = ImSaturate(((local_48->MousePos).y - local_58.y) / (local_64 - 1.0));
        local_c6 = 1;
        local_c5 = 1;
      }
    }
  }
  else {
    ImVec2::ImVec2(&local_d0,local_64 + (local_40->ItemInnerSpacing).x + local_60,local_64);
    InvisibleButton((char *)in_stack_fffffffffffffb88,(ImVec2 *)in_stack_fffffffffffffb80);
    bVar1 = IsItemActive();
    if (bVar1) {
      in_stack_fffffffffffffca0 = SUB84(&local_9c,0);
      local_d8 = operator-(in_stack_fffffffffffffb38,(ImVec2 *)0x18d87c);
      local_e0 = operator-(in_stack_fffffffffffffb38,(ImVec2 *)0x18d8a1);
      local_e4 = ImLengthSqr(&local_d8);
      if (((local_94 - 1.0) * (local_94 - 1.0) <= local_e4) &&
         (local_e4 <= (local_90 + 1.0) * (local_90 + 1.0))) {
        fVar3 = ImAtan2(0.0,2.282002e-39);
        local_bc = (fVar3 / 3.1415927) * 0.5;
        if (local_bc < 0.0) {
          local_bc = local_bc + 1.0;
        }
        local_c6 = 1;
        local_c5 = 1;
      }
      in_stack_fffffffffffffc88 = (ImVec4 *)0x8000000080000000;
      in_stack_fffffffffffffc90 = (char *)0x8000000080000000;
      in_stack_fffffffffffffc9c = 3.1415927;
      local_e8 = ImCos(0.0);
      local_ec = ImSin(0.0);
      local_f4 = ImRotate(in_stack_fffffffffffffb38,0.0,2.282344e-39);
      bVar1 = ImTriangleContainsPoint(&local_a8,&local_b0,&local_b8,&local_f4);
      if (bVar1) {
        local_fc = ImRotate(in_stack_fffffffffffffb38,0.0,2.282464e-39);
        bVar1 = ImTriangleContainsPoint(&local_a8,&local_b0,&local_b8,&local_fc);
        if (!bVar1) {
          local_104 = ImTriangleClosestPoint
                                ((ImVec2 *)in_stack_fffffffffffffb98,
                                 (ImVec2 *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                                 (ImVec2 *)in_stack_fffffffffffffb80);
          local_fc = local_104;
        }
        in_stack_fffffffffffffb38 = &local_110;
        ImTriangleBarycentricCoords
                  ((ImVec2 *)in_stack_fffffffffffffb80,
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                   in_stack_fffffffffffffb68,
                   (float *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                   (float *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                   (float *)in_stack_fffffffffffffb90);
        local_c4 = ImClamp<float>(1.0 - local_110.y,0.0001,1.0);
        local_c0 = ImClamp<float>(local_108 / local_c4,0.0001,1.0);
        local_c7 = 1;
        local_c5 = 1;
      }
    }
    if ((local_14 & 8) == 0) {
      OpenPopupOnItemClick((char *)in_stack_fffffffffffffb48,(int)in_stack_fffffffffffffb44);
    }
  }
  if ((local_4d & 1) != 0) {
    ImVec2::ImVec2(&local_130,local_6c,local_58.y);
    SetCursorScreenPos((ImVec2 *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    ImVec2::ImVec2(&local_138,local_60,local_64);
    InvisibleButton((char *)in_stack_fffffffffffffb88,(ImVec2 *)in_stack_fffffffffffffb80);
    bVar1 = IsItemActive();
    if (bVar1) {
      fVar3 = ImSaturate(((local_48->MousePos).y - local_58.y) / (local_64 - 1.0));
      local_10[3] = 1.0 - fVar3;
      local_c5 = 1;
    }
  }
  PopItemFlag();
  if ((local_14 & 0x100) == 0) {
    SameLine(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40);
    BeginGroup();
  }
  if (((local_14 & 0x80) == 0) &&
     (local_140 = FindRenderedTextEnd(local_8,(char *)0x0), local_8 != local_140)) {
    if ((local_14 & 0x100) != 0) {
      SameLine(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40);
    }
    TextUnformatted((char *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                    (char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
  }
  if ((local_14 & 0x100) == 0) {
    PushItemFlag((ImGuiItemFlags)in_stack_fffffffffffffb44,
                 SUB41((uint)in_stack_fffffffffffffb40 >> 0x18,0));
    fVar3 = local_10[2];
    if ((local_14 & 2) == 0) {
      local_388 = local_10[3];
    }
    else {
      local_388 = 1.0;
    }
    ImVec4::ImVec4(&local_150,*local_10,local_10[1],fVar3,local_388);
    if ((local_14 & 0x80) != 0) {
      Text("Current");
    }
    ImVec2::ImVec2(&local_158,local_5c * 3.0,local_5c + local_5c);
    size.y = in_stack_fffffffffffffca0;
    size.x = in_stack_fffffffffffffc9c;
    ColorButton(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,(ImGuiColorEditFlags)fVar3,size)
    ;
    if (local_20 != (float *)0x0) {
      Text("Original");
      if ((local_14 & 2) == 0) {
        fVar4 = local_20[3];
      }
      else {
        fVar4 = 1.0;
      }
      ImVec4::ImVec4(&local_168,*local_20,local_20[1],local_20[2],fVar4);
      ImVec2::ImVec2(&local_170,local_5c * 3.0,local_5c + local_5c);
      size_00.y = in_stack_fffffffffffffca0;
      size_00.x = in_stack_fffffffffffffc9c;
      bVar1 = ColorButton(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                          (ImGuiColorEditFlags)fVar3,size_00);
      if (bVar1) {
        memcpy(local_10,local_20,(long)local_4c << 2);
        local_c5 = 1;
      }
    }
    PopItemFlag();
    EndGroup();
  }
  if (((local_c6 & 1) != 0) || ((local_c7 & 1) != 0)) {
    ColorConvertHSVtoRGB
              (in_stack_fffffffffffffb80.y,in_stack_fffffffffffffb80.x,in_stack_fffffffffffffb7c,
               (float *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               &in_stack_fffffffffffffb68->x,
               (float *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
  }
  local_171 = 0;
  if ((local_14 & 0x20) == 0) {
    PushItemWidth(in_stack_fffffffffffffb44);
    local_178 = 0x18e001a;
    local_17c = local_14 & 0x18e001a | 4;
    if ((((local_14 & 0x100000) != 0) || ((local_14 & 0x700000) == 0)) &&
       (bVar1 = ColorEdit4((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                           in_stack_fffffffffffffddc), bVar1)) {
      local_3b9 = 0;
      if (local_28->ActiveId != 0) {
        local_3b9 = local_28->ActiveIdAllowOverlap ^ 0xff;
      }
      local_171 = local_3b9 & 1;
      local_c5 = 1;
    }
    if (((local_14 & 0x200000) != 0) || ((local_14 & 0x700000) == 0)) {
      bVar1 = ColorEdit4((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                         in_stack_fffffffffffffddc);
      local_c5 = (local_c5 & 1) != 0 || bVar1;
    }
    if (((local_14 & 0x400000) != 0) || ((local_14 & 0x700000) == 0)) {
      bVar1 = ColorEdit4((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                         in_stack_fffffffffffffddc);
      local_c5 = (local_c5 & 1) != 0 || bVar1;
    }
    PopItemWidth();
  }
  if ((((local_171 & 1) != 0) &&
      (ColorConvertRGBtoHSV
                 (in_stack_fffffffffffffb64,in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c,
                  (float *)in_stack_fffffffffffffb50,&in_stack_fffffffffffffb48->x,
                  (float *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)),
      local_180 <= 0.0)) && (0.0 < local_bc)) {
    if (local_188 <= 0.0) {
      if ((local_c4 != local_188) || (NAN(local_c4) || NAN(local_188))) {
        ColorConvertHSVtoRGB
                  (in_stack_fffffffffffffb80.y,in_stack_fffffffffffffb80.x,in_stack_fffffffffffffb7c
                   ,(float *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                   &in_stack_fffffffffffffb68->x,
                   (float *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
        goto LAB_0018e6eb;
      }
    }
    if (local_184 <= 0.0) {
      ColorConvertHSVtoRGB
                (in_stack_fffffffffffffb80.y,in_stack_fffffffffffffb80.x,in_stack_fffffffffffffb7c,
                 (float *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                 &in_stack_fffffffffffffb68->x,
                 (float *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
    }
  }
LAB_0018e6eb:
  ImVec4::ImVec4(&local_198,1.0,1.0,1.0,1.0);
  ColorConvertHSVtoRGB
            (in_stack_fffffffffffffb80.y,in_stack_fffffffffffffb80.x,in_stack_fffffffffffffb7c,
             (float *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
             &in_stack_fffffffffffffb68->x,
             (float *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
  local_19c = ColorConvertFloat4ToU32
                        ((ImVec4 *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  ImVec4::ImVec4(&local_1b0,*local_10,local_10[1],local_10[2],1.0);
  local_1a0 = ColorConvertFloat4ToU32
                        ((ImVec4 *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  local_1d8 = 0xff00ffffff0000ff;
  local_1d0 = 0xffffff00ff00ff00;
  local_1c8 = 0xffff00ffffff0000;
  local_1c0 = 0xff0000ff;
  ImVec2::ImVec2(&local_1e0);
  if ((local_14 & 0x4000000) == 0) {
    if ((local_14 & 0x2000000) != 0) {
      in_stack_fffffffffffffb90 = (ImDrawList *)&stack0xfffffffffffffd70;
      in_stack_fffffffffffffb98 = local_38;
      ImVec2::ImVec2((ImVec2 *)in_stack_fffffffffffffb90,local_64,local_64);
      in_stack_fffffffffffffbb0 = (ImVec2)&local_58;
      local_288 = operator+(in_stack_fffffffffffffb38,(ImVec2 *)0x18f006);
      lhs = (ImVec2 *)CONCAT44((int)((ulong)in_stack_fffffffffffffb38 >> 0x20),0xffffffff);
      ImDrawList::AddRectFilledMultiColor
                ((ImDrawList *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                 in_stack_fffffffffffffb68,
                 (ImVec2 *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                 (ImU32)in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58,
                 (ImU32)((ulong)in_stack_fffffffffffffb50 >> 0x20),
                 (ImU32)in_stack_fffffffffffffb80.x);
      in_stack_fffffffffffffba0 = (ImVec2)local_2a0;
      in_stack_fffffffffffffba8 = local_38;
      ImVec2::ImVec2((ImVec2 *)in_stack_fffffffffffffba0,local_64,local_64);
      local_298 = operator+(lhs,(ImVec2 *)0x18f079);
      in_stack_fffffffffffffb38 = (ImVec2 *)CONCAT44((int)((ulong)lhs >> 0x20),0xff000000);
      ImDrawList::AddRectFilledMultiColor
                ((ImDrawList *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                 in_stack_fffffffffffffb68,
                 (ImVec2 *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                 (ImU32)in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58,
                 (ImU32)((ulong)in_stack_fffffffffffffb50 >> 0x20),
                 (ImU32)in_stack_fffffffffffffb80.x);
      local_2a8 = local_58;
      in_stack_fffffffffffffbb8 = (ImVec2)local_2b8;
      ImVec2::ImVec2((ImVec2 *)in_stack_fffffffffffffbb8,local_64,local_64);
      local_2b0 = operator+(in_stack_fffffffffffffb38,(ImVec2 *)0x18f0f1);
      RenderFrameBorder(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                        (float)((ulong)in_stack_fffffffffffffb90 >> 0x20));
      in_stack_fffffffffffffbc0 = local_58.x;
      fVar3 = ImSaturate(local_c0);
      local_1e0.x = ImClamp<float>((float)(int)(fVar3 * local_64 + in_stack_fffffffffffffbc0 + 0.5),
                                   local_58.x + 2.0,(local_58.x + local_64) - 2.0);
      in_stack_fffffffffffffbc4 = local_58.y;
      fVar3 = ImSaturate(1.0 - local_c4);
      fVar3 = ImClamp<float>((float)(int)(fVar3 * local_64 + in_stack_fffffffffffffbc4 + 0.5),
                             local_58.y + 2.0,(local_58.y + local_64) - 2.0);
      local_1e0.y = fVar3;
      local_2bc = 0;
      while( true ) {
        uVar7 = (uint)((ulong)in_stack_fffffffffffffb38 >> 0x20);
        if (5 < local_2bc) break;
        ImVec2::ImVec2(&local_2c4,local_68,(float)local_2bc * (local_64 / 6.0) + local_58.y);
        ImVec2::ImVec2(&local_2cc,local_68 + local_60,
                       (float)(local_2bc + 1) * (local_64 / 6.0) + local_58.y);
        in_stack_fffffffffffffb38 = (ImVec2 *)((ulong)uVar7 << 0x20);
        ImDrawList::AddRectFilledMultiColor
                  ((ImDrawList *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                   in_stack_fffffffffffffb68,
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                   (ImU32)in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58,
                   (ImU32)((ulong)in_stack_fffffffffffffb50 >> 0x20),
                   (ImU32)in_stack_fffffffffffffb80.x);
        local_2bc = local_2bc + 1;
      }
      local_2d0 = (float)(int)(local_bc * local_64 + local_58.y + 0.5);
      ImVec2::ImVec2(&local_2d8,local_68,local_58.y);
      ImVec2::ImVec2(&local_2e0,local_68 + local_60,local_58.y + local_64);
      RenderFrameBorder(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                        (float)((ulong)in_stack_fffffffffffffb90 >> 0x20));
      fVar3 = 1.0;
      in_stack_fffffffffffffb80 = local_38;
      ImVec2::ImVec2(&local_2e8,local_68 - 1.0,local_2d0);
      ImVec2::ImVec2(&local_2f0,local_70 + fVar3,local_70);
      pos.y = in_stack_fffffffffffffbc4;
      pos.x = in_stack_fffffffffffffbc0;
      RenderArrowsForVerticalBar
                ((ImDrawList *)in_stack_fffffffffffffbb0,pos,in_stack_fffffffffffffbb8,
                 in_stack_fffffffffffffba8.y);
    }
    fVar4 = in_stack_fffffffffffffb80.x;
    fVar3 = (float)((ulong)in_stack_fffffffffffffb38 >> 0x20);
  }
  else {
    local_1e4 = 1.5 / local_90;
    local_1e8 = ImMax<int>(4,(int)local_90 / 0xc);
    for (local_1ec = 0; local_1ec < 6; local_1ec = local_1ec + 1) {
      local_1f0 = ((float)local_1ec / 6.0 + (float)local_1ec / 6.0) * 3.1415927 - local_1e4;
      fVar3 = ((float)local_1ec + 1.0) / 6.0;
      local_1f4 = (fVar3 + fVar3) * 3.1415927 + local_1e4;
      local_1f8 = ((ImVector<ImDrawVert> *)((long)local_38 + 0x20))->Size;
      ImDrawList::PathArcTo
                ((ImDrawList *)in_stack_fffffffffffffb80,
                 (ImVec2 *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                 in_stack_fffffffffffffb74,in_stack_fffffffffffffb70,
                 (float)((ulong)in_stack_fffffffffffffb68 >> 0x20),(int)in_stack_fffffffffffffb68);
      ImDrawList::PathStroke
                (in_stack_fffffffffffffb50,(ImU32)((ulong)in_stack_fffffffffffffb48 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffb48 >> 0x18,0),in_stack_fffffffffffffb44);
      fVar3 = local_9c.x;
      local_1fc = ((ImVector<ImDrawVert> *)((long)local_38 + 0x20))->Size;
      fVar5 = ImCos(0.0);
      fVar4 = local_9c.y;
      fVar5 = fVar5 * local_94;
      fVar6 = ImSin(0.0);
      ImVec2::ImVec2(&local_204,fVar5 + fVar3,fVar6 * local_94 + fVar4);
      fVar3 = local_9c.x;
      fVar5 = ImCos(0.0);
      fVar4 = local_9c.y;
      fVar5 = fVar5 * local_94;
      fVar6 = ImSin(0.0);
      ImVec2::ImVec2(&local_20c,fVar5 + fVar3,fVar6 * local_94 + fVar4);
      ShadeVertsLinearColorGradientKeepAlpha
                (in_stack_fffffffffffffb90,(int)((ulong)in_stack_fffffffffffffb88 >> 0x20),
                 (int)in_stack_fffffffffffffb88,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                 (ImU32)in_stack_fffffffffffffb80.y,(ImU32)in_stack_fffffffffffffb80.x);
    }
    fVar3 = ImCos(0.0);
    fVar4 = in_stack_fffffffffffffb80.x;
    local_228 = ImSin(0.0);
    ImVec2::ImVec2(&local_230,fVar3 * (local_94 + local_90) * 0.5 + local_9c.x,
                   local_228 * (local_94 + local_90) * 0.5 + local_9c.y);
    if ((local_c6 & 1) == 0) {
      local_3ec = local_8c * 0.55;
    }
    else {
      local_3ec = local_8c * 0.65;
    }
    local_234 = local_3ec;
    local_238 = ImClamp<int>((int)(local_3ec / 1.4),9,0x20);
    ImDrawList::AddCircleFilled
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb44,
               (ImU32)in_stack_fffffffffffffb40,(int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
    fVar5 = 1.0;
    ImDrawList::AddCircle
              ((ImDrawList *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               (ImVec2 *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
               (float)((ulong)in_stack_fffffffffffffb50 >> 0x20),(ImU32)in_stack_fffffffffffffb50,
               (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),SUB84(in_stack_fffffffffffffb48,0));
    ImDrawList::AddCircle
              ((ImDrawList *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               (ImVec2 *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
               (float)((ulong)in_stack_fffffffffffffb50 >> 0x20),(ImU32)in_stack_fffffffffffffb50,
               (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),SUB84(in_stack_fffffffffffffb48,0));
    local_248 = ImRotate(in_stack_fffffffffffffb38,0.0,2.289128e-39);
    local_240 = operator+(in_stack_fffffffffffffb38,(ImVec2 *)0x18ed4e);
    local_258 = ImRotate(in_stack_fffffffffffffb38,0.0,2.289237e-39);
    local_250 = operator+(in_stack_fffffffffffffb38,(ImVec2 *)0x18ed94);
    local_268 = ImRotate(in_stack_fffffffffffffb38,0.0,2.289335e-39);
    local_260 = operator+(in_stack_fffffffffffffb38,(ImVec2 *)0x18edda);
    fVar3 = (float)((ulong)in_stack_fffffffffffffb38 >> 0x20);
    local_270 = GetFontTexUvWhitePixel();
    ImDrawList::PrimReserve
              (in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
               (int)in_stack_fffffffffffffb48);
    ImDrawList::PrimVtx(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                        (ImVec2 *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                        (ImU32)fVar3);
    ImDrawList::PrimVtx(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                        (ImVec2 *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                        (ImU32)fVar3);
    ImDrawList::PrimVtx(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                        (ImVec2 *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                        (ImU32)fVar3);
    ImDrawList::PrimVtx(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                        (ImVec2 *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                        (ImU32)fVar3);
    ImDrawList::PrimVtx(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                        (ImVec2 *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                        (ImU32)fVar3);
    ImDrawList::PrimVtx(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                        (ImVec2 *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                        (ImU32)fVar3);
    ImDrawList::AddTriangle
              ((ImDrawList *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               (ImVec2 *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
               (ImVec2 *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
               (ImU32)in_stack_fffffffffffffb44,in_stack_fffffffffffffb40);
    ImSaturate(local_c0);
    local_280 = ImLerp(in_stack_fffffffffffffb48,
                       (ImVec2 *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),fVar3
                      );
    ImSaturate(fVar5 - local_c4);
    local_278 = ImLerp(in_stack_fffffffffffffb48,
                       (ImVec2 *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),fVar3
                      );
    local_1e0 = local_278;
  }
  uVar9 = 0x40c00000;
  local_2f4 = 0x41200000;
  if ((local_c7 & 1) == 0) {
    local_2f4 = 0x40c00000;
  }
  ImDrawList::AddCircleFilled
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb44,
             (ImU32)in_stack_fffffffffffffb40,(int)fVar3);
  ImDrawList::AddCircle
            ((ImDrawList *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
             (ImVec2 *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
             (float)((ulong)in_stack_fffffffffffffb50 >> 0x20),(ImU32)in_stack_fffffffffffffb50,
             (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),SUB84(in_stack_fffffffffffffb48,0));
  ImDrawList::AddCircle
            ((ImDrawList *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
             (ImVec2 *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
             (float)((ulong)in_stack_fffffffffffffb50 >> 0x20),(ImU32)in_stack_fffffffffffffb50,
             (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),SUB84(in_stack_fffffffffffffb48,0));
  if ((local_4d & 1) != 0) {
    local_2f8 = ImSaturate(local_10[3]);
    this = &local_308;
    ImRect::ImRect((ImRect *)in_stack_fffffffffffffb50,(float)((ulong)this >> 0x20),SUB84(this,0),
                   in_stack_fffffffffffffb44,in_stack_fffffffffffffb40);
    local_310 = local_308.Min;
    col_bot_right = (ImU32)((ulong)&local_308.Max >> 0x20);
    local_318 = local_308.Max;
    ImRect::GetWidth(this);
    fVar3 = 0.5;
    uVar8 = 0;
    ImVec2::ImVec2(&local_320,0.0,0.0);
    RenderColorRectWithAlphaCheckerboard
              (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
               (ImU32)in_stack_fffffffffffffb98.y,in_stack_fffffffffffffb98.x,
               in_stack_fffffffffffffba0,(float)((ulong)in_stack_fffffffffffffb90 >> 0x20),
               (int)in_stack_fffffffffffffb90);
    fVar6 = in_stack_fffffffffffffba8.y;
    fVar5 = (float)((ulong)in_stack_fffffffffffffb90 >> 0x20);
    ImDrawList::AddRectFilledMultiColor
              ((ImDrawList *)CONCAT44(uVar9,in_stack_fffffffffffffb70),in_stack_fffffffffffffb68,
               (ImVec2 *)CONCAT44(in_stack_fffffffffffffb64,uVar8),(ImU32)fVar3,
               in_stack_fffffffffffffb58,col_bot_right,(ImU32)fVar4);
    fVar4 = 1.0;
    local_324 = (float)(int)((1.0 - local_2f8) * local_64 + local_58.y + fVar3);
    local_330 = local_308.Min;
    local_338 = local_308.Max;
    RenderFrameBorder(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,fVar5);
    ImVec2::ImVec2(&local_340,local_6c - fVar4,local_324);
    ImVec2::ImVec2(&local_348,local_70 + fVar4,local_70);
    pos_00.y = in_stack_fffffffffffffbc4;
    pos_00.x = in_stack_fffffffffffffbc0;
    RenderArrowsForVerticalBar
              ((ImDrawList *)in_stack_fffffffffffffbb0,pos_00,in_stack_fffffffffffffbb8,fVar6);
  }
  EndGroup();
  if (((local_c5 & 1) != 0) && (iVar2 = memcmp(local_88,local_10,(long)local_4c << 2), iVar2 == 0))
  {
    local_c5 = 0;
  }
  if ((local_c5 & 1) != 0) {
    MarkItemEdited((local_30->DC).LastItemId);
  }
  PopID();
  return (bool)(local_c5 & 1);
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImDrawList* draw_list = window->DrawList;

    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__PickerMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__PickerMask;
    IM_ASSERT(ImIsPowerOfTwo((int)(flags & ImGuiColorEditFlags__PickerMask))); // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, CalcItemWidth() - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = (float)(int)(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size*0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H,S,V;
    ColorConvertRGBtoHSV(col[0], col[1], col[2], H, S, V);

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner-1)*(wheel_r_inner-1) && initial_dist2 <= (wheel_r_outer+1)*(wheel_r_outer+1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI*0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size-1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextUnformatted(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");
        ColorButton("##current", col_v4, (flags & (ImGuiColorEditFlags_HDR|ImGuiColorEditFlags_AlphaPreview|ImGuiColorEditFlags_AlphaPreviewHalf|ImGuiColorEditFlags_NoTooltip)), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & (ImGuiColorEditFlags_HDR|ImGuiColorEditFlags_AlphaPreview|ImGuiColorEditFlags_AlphaPreviewHalf|ImGuiColorEditFlags_NoTooltip)), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
        ColorConvertHSVtoRGB(H >= 1.0f ? H - 10 * 1e-6f : H, S > 0.0f ? S : 10*1e-6f, V > 0.0f ? V : 1e-6f, col[0], col[1], col[2]);

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_RGB || (flags & ImGuiColorEditFlags__InputsMask) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_RGB))
            {
                // FIXME: Hackily differenciating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_HSV || (flags & ImGuiColorEditFlags__InputsMask) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_HSV);
        if (flags & ImGuiColorEditFlags_HEX || (flags & ImGuiColorEditFlags__InputsMask) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_HEX);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap)
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    ImVec4 hue_color_f(1, 1, 1, 1); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 col32_no_alpha = ColorConvertFloat4ToU32(ImVec4(col[0], col[1], col[2], 1.0f));

    const ImU32 hue_colors[6+1] = { IM_COL32(255,0,0,255), IM_COL32(255,255,0,255), IM_COL32(0,255,0,255), IM_COL32(0,255,255,255), IM_COL32(0,0,255,255), IM_COL32(255,0,255,255), IM_COL32(255,0,0,255) };
    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 1.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(IM_COL32_WHITE, false, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, hue_colors[n], hue_colors[n+1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad+1, IM_COL32(128,128,128,255), hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, IM_COL32_WHITE, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, IM_COL32_WHITE);
        draw_list->PrimVtx(tra, uv_white, IM_COL32_BLACK_TRANS);
        draw_list->PrimVtx(trb, uv_white, IM_COL32_BLACK);
        draw_list->PrimVtx(trc, uv_white, IM_COL32_BLACK_TRANS);
        draw_list->AddTriangle(tra, trb, trc, IM_COL32(128,128,128,255), 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), IM_COL32_WHITE, hue_color32, hue_color32, IM_COL32_WHITE);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), IM_COL32_BLACK_TRANS, IM_COL32_BLACK_TRANS, IM_COL32_BLACK, IM_COL32_BLACK);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp((float)(int)(picker_pos.x + ImSaturate(S)     * sv_picker_size + 0.5f), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp((float)(int)(picker_pos.y + ImSaturate(1 - V) * sv_picker_size + 0.5f), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), hue_colors[i], hue_colors[i], hue_colors[i + 1], hue_colors[i + 1]);
        float bar0_line_y = (float)(int)(picker_pos.y + H * sv_picker_size + 0.5f);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, col32_no_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad+1, IM_COL32(128,128,128,255), 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, IM_COL32_WHITE, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(bar1_bb.Min, bar1_bb.Max, IM_COL32(0,0,0,0), bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, col32_no_alpha, col32_no_alpha, col32_no_alpha & ~IM_COL32_A_MASK, col32_no_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = (float)(int)(picker_pos.y + (1.0f - alpha) * sv_picker_size + 0.5f);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed)
        MarkItemEdited(window->DC.LastItemId);

    PopID();

    return value_changed;
}